

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedLocation.h
# Opt level: O2

void __thiscall DIS::IsPartOfPdu::setNamedLocationID(IsPartOfPdu *this,NamedLocation *pX)

{
  unsigned_short uVar1;
  
  uVar1 = pX->_stationNumber;
  (this->_namedLocationID)._stationName = pX->_stationName;
  (this->_namedLocationID)._stationNumber = uVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT NamedLocation
{
protected:
  /** station name enumeration */
  unsigned short _stationName; 

  /** station number */
  unsigned short _stationNumber; 


 public:
    NamedLocation();
    virtual ~NamedLocation();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getStationName() const; 
    void setStationName(unsigned short pX); 

    unsigned short getStationNumber() const; 
    void setStationNumber(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const NamedLocation& rhs) const;
}